

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cc
# Opt level: O0

void __thiscall draco::EntryValue::EntryValue(EntryValue *this,EntryValue *value)

{
  reference __dest;
  const_reference __src;
  size_type __n;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__new_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffe0;
  
  __new_size = in_RDI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1bf3b5);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RSI);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_ffffffffffffffe0,(size_type)__new_size);
  __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RDI,0);
  __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RSI,0);
  __n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RSI);
  memcpy(__dest,__src,__n);
  return;
}

Assistant:

EntryValue::EntryValue(const EntryValue &value) {
  data_.resize(value.data_.size());
  memcpy(&data_[0], &value.data_[0], value.data_.size());
}